

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O1

OutputFile * __thiscall re2c::OutputFile::wuser_start_label(OutputFile *this)

{
  OutputBlock *pOVar1;
  pointer pcVar2;
  string label;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  pOVar1 = (this->blocks).
           super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  pcVar2 = (pOVar1->user_start_label)._M_dataplus._M_p;
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar2,pcVar2 + (pOVar1->user_start_label)._M_string_length);
  if (local_30 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &((this->blocks).
                 super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish[-1]->fragments).
                super__Vector_base<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>.
                _M_impl.super__Vector_impl_data._M_finish[-1]->stream,(char *)local_38,local_30);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &((this->blocks).
                 super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish[-1]->fragments).
                super__Vector_base<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>.
                _M_impl.super__Vector_impl_data._M_finish[-1]->stream,":\n",2);
  }
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return this;
}

Assistant:

OutputFile & OutputFile::wuser_start_label ()
{
	const std::string label = blocks.back ()->user_start_label;
	if (!label.empty ())
	{
		wstring(label).ws(":\n");
	}
	return *this;
}